

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_binary.c
# Opt level: O1

int archive_write_set_format_cpio_binary(archive *_a,int format)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  int iVar4;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_cpio_binary");
  iVar4 = -0x1e;
  if (iVar1 == -0x1e) {
    return -0x1e;
  }
  if ((code *)_a[2].archive_format_name != (code *)0x0) {
    (*(code *)_a[2].archive_format_name)(_a);
  }
  pvVar2 = calloc(1,0x40);
  if (pvVar2 == (void *)0x0) {
    pcVar3 = "Can\'t allocate cpio data";
    iVar1 = 0xc;
LAB_0016b3c6:
    archive_set_error(_a,iVar1,pcVar3);
  }
  else {
    _a[1].read_data_offset = (int64_t)pvVar2;
    _a[1].read_data_output_offset = (int64_t)"cpio";
    *(code **)&_a[1].read_data_is_posix_read = archive_write_binary_options;
    *(code **)(_a + 2) = archive_write_binary_header;
    _a[2].vtable = (archive_vtable_conflict *)archive_write_binary_data;
    _a[1].read_data_requested = (size_t)archive_write_binary_finish_entry;
    *(code **)&_a[2].archive_format = archive_write_binary_close;
    _a[2].archive_format_name = (char *)archive_write_binary_free;
    _a->archive_format = format;
    if (format == 0x10002) {
      pcVar3 = "7th Edition cpio";
    }
    else {
      if (format != 0x10007) {
        pcVar3 = "binary format must be \'pwb\' or \'bin\'";
        iVar1 = 0x16;
        goto LAB_0016b3c6;
      }
      pcVar3 = "PWB cpio";
    }
    _a->archive_format_name = pcVar3;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
archive_write_set_format_cpio_binary(struct archive *_a, int format)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct cpio *cpio;

	if (sizeof(struct cpio_binary_header) != HSIZE) {
		archive_set_error(&a->archive, EINVAL,
				  "Binary cpio format not supported on this platform");
		return (ARCHIVE_FATAL);
	}

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_cpio_binary");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	cpio = (struct cpio *)calloc(1, sizeof(*cpio));
	if (cpio == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate cpio data");
		return (ARCHIVE_FATAL);
	}
	a->format_data = cpio;
	a->format_name = "cpio";
	a->format_options = archive_write_binary_options;
	a->format_write_header = archive_write_binary_header;
	a->format_write_data = archive_write_binary_data;
	a->format_finish_entry = archive_write_binary_finish_entry;
	a->format_close = archive_write_binary_close;
	a->format_free = archive_write_binary_free;
	a->archive.archive_format = format;
	switch (format) {
	case ARCHIVE_FORMAT_CPIO_PWB:
		a->archive.archive_format_name = "PWB cpio";
		break;
	case ARCHIVE_FORMAT_CPIO_BIN_LE:
		a->archive.archive_format_name = "7th Edition cpio";
		break;
	default:
		archive_set_error(&a->archive, EINVAL, "binary format must be 'pwb' or 'bin'");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}